

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O0

void testChlistHelper(exr_context_t f)

{
  int iVar1;
  exr_result_t eVar2;
  ostream *poVar3;
  char *pcVar4;
  ostream *poVar5;
  exr_result_t _test_rv_40;
  exr_result_t _test_rv_39;
  exr_result_t _test_rv_38;
  exr_result_t _test_rv_37;
  exr_result_t _test_rv_36;
  exr_result_t _test_rv_35;
  exr_result_t _test_rv_34;
  exr_result_t _test_rv_33;
  exr_result_t _test_rv_32;
  exr_result_t _test_rv_31;
  exr_attr_chlist_t cl2;
  exr_result_t _test_rv_30;
  exr_result_t _test_rv_29;
  exr_result_t _test_rv_28;
  exr_result_t _test_rv_27;
  exr_result_t _test_rv_26;
  exr_result_t _test_rv_25;
  exr_result_t _test_rv_24;
  exr_result_t _test_rv_23;
  exr_result_t _test_rv_22;
  exr_result_t _test_rv_21;
  exr_result_t _test_rv_20;
  exr_result_t _test_rv_19;
  exr_result_t _test_rv_18;
  exr_result_t _test_rv_17;
  exr_result_t _test_rv_16;
  exr_result_t _test_rv_15;
  exr_result_t _test_rv_14;
  exr_result_t _test_rv_13;
  exr_result_t _test_rv_12;
  exr_result_t _test_rv_11;
  exr_result_t _test_rv_10;
  exr_result_t _test_rv_9;
  exr_result_t _test_rv_8;
  exr_result_t _test_rv_7;
  exr_result_t _test_rv_6;
  exr_result_t _test_rv_5;
  exr_result_t _test_rv_4;
  exr_result_t _test_rv_3;
  exr_result_t _test_rv_2;
  exr_result_t _test_rv_1;
  exr_result_t _test_rv;
  exr_attr_chlist_t cl;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffcec;
  uint in_stack_fffffffffffffcf4;
  char *in_stack_fffffffffffffcf8;
  exr_attr_chlist_t *in_stack_fffffffffffffd00;
  exr_context_t in_stack_fffffffffffffd08;
  exr_context_t in_stack_fffffffffffffd10;
  exr_context_t in_stack_fffffffffffffd18;
  int32_t in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd58;
  exr_perceptual_treatment_t islinear;
  undefined8 in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  exr_attr_chlist_t *in_stack_fffffffffffffd70;
  exr_context_t in_stack_fffffffffffffd78;
  int32_t in_stack_fffffffffffffd90;
  int32_t in_stack_fffffffffffffd98;
  int local_a8 [2];
  long local_a0;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18 [2];
  long local_10;
  
  islinear = (exr_perceptual_treatment_t)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  memset(local_18,0,0x10);
  exr_attr_chlist_destroy(in_stack_fffffffffffffd18,(exr_attr_chlist_t *)in_stack_fffffffffffffd10);
  exr_attr_chlist_destroy(in_stack_fffffffffffffd18,(exr_attr_chlist_t *)in_stack_fffffffffffffd10);
  local_1c = exr_attr_chlist_init
                       (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                        (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  if (local_1c != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_1c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,
                   (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  }
  local_20 = exr_attr_chlist_init
                       (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                        (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  if (local_20 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_20);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,
                   (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  }
  local_24 = exr_attr_chlist_init
                       (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                        (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  if (local_24 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_24);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_24);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,
                   (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  }
  local_28 = exr_attr_chlist_init
                       (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                        (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  if (local_28 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_28);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,
                   (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  }
  exr_attr_chlist_destroy(in_stack_fffffffffffffd18,(exr_attr_chlist_t *)in_stack_fffffffffffffd10);
  local_2c = exr_attr_chlist_destroy
                       (in_stack_fffffffffffffd18,(exr_attr_chlist_t *)in_stack_fffffffffffffd10);
  if (local_2c != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_2c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,
                   (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  }
  set_malloc_fail_on(1);
  local_30 = exr_attr_chlist_init
                       (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                        (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  set_malloc_fail_off();
  if (local_30 != 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_30);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_30);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,
                   (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  }
  exr_attr_chlist_destroy(in_stack_fffffffffffffd18,(exr_attr_chlist_t *)in_stack_fffffffffffffd10);
  uVar6 = 1;
  local_34 = exr_attr_chlist_add(in_stack_fffffffffffffd10,
                                 (exr_attr_chlist_t *)in_stack_fffffffffffffd08,
                                 (char *)in_stack_fffffffffffffd00,
                                 (exr_pixel_type_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                                 (exr_perceptual_treatment_t)in_stack_fffffffffffffcf8,
                                 in_stack_fffffffffffffcf4,in_stack_fffffffffffffd20);
  if (local_34 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_34);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_34);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 1;
  local_38 = exr_attr_chlist_add(in_stack_fffffffffffffd10,
                                 (exr_attr_chlist_t *)in_stack_fffffffffffffd08,
                                 (char *)in_stack_fffffffffffffd00,
                                 (exr_pixel_type_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                                 (exr_perceptual_treatment_t)in_stack_fffffffffffffcf8,
                                 in_stack_fffffffffffffcf4,in_stack_fffffffffffffd20);
  if (local_38 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_38);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_38);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 1;
  local_3c = exr_attr_chlist_add(in_stack_fffffffffffffd10,
                                 (exr_attr_chlist_t *)in_stack_fffffffffffffd08,
                                 (char *)in_stack_fffffffffffffd00,
                                 (exr_pixel_type_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                                 (exr_perceptual_treatment_t)in_stack_fffffffffffffcf8,
                                 in_stack_fffffffffffffcf4,in_stack_fffffffffffffd20);
  if (local_3c != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_3c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 1;
  local_40 = exr_attr_chlist_add(in_stack_fffffffffffffd10,
                                 (exr_attr_chlist_t *)in_stack_fffffffffffffd08,
                                 (char *)in_stack_fffffffffffffd00,
                                 (exr_pixel_type_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                                 (exr_perceptual_treatment_t)in_stack_fffffffffffffcf8,
                                 in_stack_fffffffffffffcf4,in_stack_fffffffffffffd20);
  if (local_40 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_40);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_40);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 1;
  local_44 = exr_attr_chlist_add(in_stack_fffffffffffffd10,
                                 (exr_attr_chlist_t *)in_stack_fffffffffffffd08,
                                 (char *)in_stack_fffffffffffffd00,
                                 (exr_pixel_type_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                                 (exr_perceptual_treatment_t)in_stack_fffffffffffffcf8,
                                 in_stack_fffffffffffffcf4,in_stack_fffffffffffffd20);
  if (local_44 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_44);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_44);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 1;
  local_48 = exr_attr_chlist_add(in_stack_fffffffffffffd10,
                                 (exr_attr_chlist_t *)in_stack_fffffffffffffd08,
                                 (char *)in_stack_fffffffffffffd00,
                                 (exr_pixel_type_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                                 (exr_perceptual_treatment_t)in_stack_fffffffffffffcf8,
                                 in_stack_fffffffffffffcf4,in_stack_fffffffffffffd20);
  if (local_48 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_48);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_48);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 1;
  local_4c = exr_attr_chlist_add(in_stack_fffffffffffffd10,
                                 (exr_attr_chlist_t *)in_stack_fffffffffffffd08,
                                 (char *)in_stack_fffffffffffffd00,
                                 (exr_pixel_type_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                                 (exr_perceptual_treatment_t)in_stack_fffffffffffffcf8,
                                 in_stack_fffffffffffffcf4,in_stack_fffffffffffffd20);
  if (local_4c != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_4c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_4c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 0;
  local_50 = exr_attr_chlist_add(in_stack_fffffffffffffd10,
                                 (exr_attr_chlist_t *)in_stack_fffffffffffffd08,
                                 (char *)in_stack_fffffffffffffd00,
                                 (exr_pixel_type_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                                 (exr_perceptual_treatment_t)in_stack_fffffffffffffcf8,
                                 in_stack_fffffffffffffcf4,in_stack_fffffffffffffd20);
  if (local_50 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_50);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_50);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 0xffffffff;
  local_54 = exr_attr_chlist_add(in_stack_fffffffffffffd10,
                                 (exr_attr_chlist_t *)in_stack_fffffffffffffd08,
                                 (char *)in_stack_fffffffffffffd00,
                                 (exr_pixel_type_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                                 (exr_perceptual_treatment_t)in_stack_fffffffffffffcf8,
                                 in_stack_fffffffffffffcf4,in_stack_fffffffffffffd20);
  if (local_54 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_54);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_54);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 2;
  local_58 = exr_attr_chlist_add(in_stack_fffffffffffffd10,
                                 (exr_attr_chlist_t *)in_stack_fffffffffffffd08,
                                 (char *)in_stack_fffffffffffffd00,
                                 (exr_pixel_type_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                                 (exr_perceptual_treatment_t)in_stack_fffffffffffffcf8,
                                 in_stack_fffffffffffffcf4,in_stack_fffffffffffffd20);
  if (local_58 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_58);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_58);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  if (local_18[0] != 1) {
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  iVar1 = strcmp(*(char **)(local_10 + 8),"foo");
  if (iVar1 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  if (*(int *)(local_10 + 0x10) != 1) {
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  if (*(char *)(local_10 + 0x14) != '\x01') {
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  if (*(int *)(local_10 + 0x18) != 1) {
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  if (*(int *)(local_10 + 0x1c) != 2) {
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  local_5c = exr_attr_chlist_destroy
                       (in_stack_fffffffffffffd18,(exr_attr_chlist_t *)in_stack_fffffffffffffd10);
  if (local_5c != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_5c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_5c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 1;
  local_60 = exr_attr_chlist_add(in_stack_fffffffffffffd10,
                                 (exr_attr_chlist_t *)in_stack_fffffffffffffd08,
                                 (char *)in_stack_fffffffffffffd00,
                                 (exr_pixel_type_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                                 (exr_perceptual_treatment_t)in_stack_fffffffffffffcf8,
                                 in_stack_fffffffffffffcf4,in_stack_fffffffffffffd20);
  if (local_60 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_60);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_60);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 1;
  local_64 = exr_attr_chlist_add(in_stack_fffffffffffffd10,
                                 (exr_attr_chlist_t *)in_stack_fffffffffffffd08,
                                 (char *)in_stack_fffffffffffffd00,
                                 (exr_pixel_type_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                                 (exr_perceptual_treatment_t)in_stack_fffffffffffffcf8,
                                 in_stack_fffffffffffffcf4,in_stack_fffffffffffffd20);
  if (local_64 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_64);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_64);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 1;
  local_68 = exr_attr_chlist_add_with_length
                       (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                        in_stack_fffffffffffffd68,
                        (int32_t)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                        (exr_pixel_type_t)in_stack_fffffffffffffd60,islinear,
                        in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
  if (local_68 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_68);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_68);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 1;
  local_6c = exr_attr_chlist_add_with_length
                       (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                        in_stack_fffffffffffffd68,
                        (int32_t)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                        (exr_pixel_type_t)in_stack_fffffffffffffd60,islinear,
                        in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
  if (local_6c != 0xc) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_6c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_6c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(0xc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 1;
  local_70 = exr_attr_chlist_add_with_length
                       (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                        in_stack_fffffffffffffd68,
                        (int32_t)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                        (exr_pixel_type_t)in_stack_fffffffffffffd60,islinear,
                        in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
  if (local_70 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_70);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_70);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 1;
  local_74 = exr_attr_chlist_add_with_length
                       (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                        in_stack_fffffffffffffd68,
                        (int32_t)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                        (exr_pixel_type_t)in_stack_fffffffffffffd60,islinear,
                        in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
  if (local_74 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_74);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_74);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 0;
  local_78 = exr_attr_chlist_add_with_length
                       (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                        in_stack_fffffffffffffd68,
                        (int32_t)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                        (exr_pixel_type_t)in_stack_fffffffffffffd60,islinear,
                        in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
  if (local_78 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_78);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_78);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 1;
  local_7c = exr_attr_chlist_add_with_length
                       (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                        in_stack_fffffffffffffd68,
                        (int32_t)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                        (exr_pixel_type_t)in_stack_fffffffffffffd60,islinear,
                        in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
  if (local_7c != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_7c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_7c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  set_malloc_fail_on(1);
  uVar6 = 1;
  local_80 = exr_attr_chlist_add_with_length
                       (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                        in_stack_fffffffffffffd68,
                        (int32_t)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                        (exr_pixel_type_t)in_stack_fffffffffffffd60,islinear,
                        in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
  set_malloc_fail_off();
  if (local_80 != 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_80);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_80);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  set_malloc_fail_on(2);
  uVar6 = 1;
  local_84 = exr_attr_chlist_add_with_length
                       (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                        in_stack_fffffffffffffd68,
                        (int32_t)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                        (exr_pixel_type_t)in_stack_fffffffffffffd60,islinear,
                        in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
  set_malloc_fail_off();
  if (local_84 != 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_84);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_84);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 1;
  local_88 = exr_attr_chlist_add(in_stack_fffffffffffffd10,
                                 (exr_attr_chlist_t *)in_stack_fffffffffffffd08,
                                 (char *)in_stack_fffffffffffffd00,
                                 (exr_pixel_type_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                                 (exr_perceptual_treatment_t)in_stack_fffffffffffffcf8,
                                 in_stack_fffffffffffffcf4,in_stack_fffffffffffffd20);
  if (local_88 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_88);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_88);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 1;
  local_8c = exr_attr_chlist_add(in_stack_fffffffffffffd10,
                                 (exr_attr_chlist_t *)in_stack_fffffffffffffd08,
                                 (char *)in_stack_fffffffffffffd00,
                                 (exr_pixel_type_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                                 (exr_perceptual_treatment_t)in_stack_fffffffffffffcf8,
                                 in_stack_fffffffffffffcf4,in_stack_fffffffffffffd20);
  if (local_8c != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_8c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_8c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 1;
  local_90 = exr_attr_chlist_add(in_stack_fffffffffffffd10,
                                 (exr_attr_chlist_t *)in_stack_fffffffffffffd08,
                                 (char *)in_stack_fffffffffffffd00,
                                 (exr_pixel_type_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                                 (exr_perceptual_treatment_t)in_stack_fffffffffffffcf8,
                                 in_stack_fffffffffffffcf4,in_stack_fffffffffffffd20);
  if (local_90 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_90);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_90);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  if (local_18[0] != 3) {
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  iVar1 = strcmp(*(char **)(local_10 + 8),"B");
  if (iVar1 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  iVar1 = strcmp(*(char **)(local_10 + 0x28),"G");
  if (iVar1 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  iVar1 = strcmp(*(char **)(local_10 + 0x48),"R");
  if (iVar1 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 1;
  local_94 = exr_attr_chlist_add(in_stack_fffffffffffffd10,
                                 (exr_attr_chlist_t *)in_stack_fffffffffffffd08,
                                 (char *)in_stack_fffffffffffffd00,
                                 (exr_pixel_type_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                                 (exr_perceptual_treatment_t)in_stack_fffffffffffffcf8,
                                 in_stack_fffffffffffffcf4,in_stack_fffffffffffffd20);
  if (local_94 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_94);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_94);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  if (local_18[0] != 3) {
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  memset(local_a8,0,0x10);
  eVar2 = exr_attr_chlist_duplicate
                    (in_stack_fffffffffffffd18,(exr_attr_chlist_t *)in_stack_fffffffffffffd10,
                     (exr_attr_chlist_t *)in_stack_fffffffffffffd08);
  if (eVar2 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  eVar2 = exr_attr_chlist_duplicate
                    (in_stack_fffffffffffffd18,(exr_attr_chlist_t *)in_stack_fffffffffffffd10,
                     (exr_attr_chlist_t *)in_stack_fffffffffffffd08);
  if (eVar2 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  eVar2 = exr_attr_chlist_duplicate
                    (in_stack_fffffffffffffd18,(exr_attr_chlist_t *)in_stack_fffffffffffffd10,
                     (exr_attr_chlist_t *)in_stack_fffffffffffffd08);
  if (eVar2 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  eVar2 = exr_attr_chlist_duplicate
                    (in_stack_fffffffffffffd18,(exr_attr_chlist_t *)in_stack_fffffffffffffd10,
                     (exr_attr_chlist_t *)in_stack_fffffffffffffd08);
  if (eVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  if (local_a8[0] != 3) {
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  iVar1 = strcmp(*(char **)(local_a0 + 8),"B");
  if (iVar1 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  iVar1 = strcmp(*(char **)(local_a0 + 0x28),"G");
  if (iVar1 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  iVar1 = strcmp(*(char **)(local_a0 + 0x48),"R");
  if (iVar1 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  eVar2 = exr_attr_chlist_destroy
                    (in_stack_fffffffffffffd18,(exr_attr_chlist_t *)in_stack_fffffffffffffd10);
  if (eVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  set_malloc_fail_on(2);
  eVar2 = exr_attr_chlist_duplicate
                    (in_stack_fffffffffffffd18,(exr_attr_chlist_t *)in_stack_fffffffffffffd10,
                     (exr_attr_chlist_t *)in_stack_fffffffffffffd08);
  set_malloc_fail_off();
  if (eVar2 != 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar5 = std::operator<<(poVar3,pcVar4);
    in_stack_fffffffffffffd20 = (int32_t)poVar3;
    poVar3 = std::operator<<(poVar5,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  eVar2 = exr_attr_chlist_destroy
                    (in_stack_fffffffffffffd18,(exr_attr_chlist_t *)in_stack_fffffffffffffd10);
  if (eVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    in_stack_fffffffffffffd18 = (exr_context_t)std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffd18,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  uVar6 = 1;
  eVar2 = exr_attr_chlist_add(in_stack_fffffffffffffd10,
                              (exr_attr_chlist_t *)in_stack_fffffffffffffd08,
                              (char *)in_stack_fffffffffffffd00,
                              (exr_pixel_type_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                              (exr_perceptual_treatment_t)in_stack_fffffffffffffcf8,
                              in_stack_fffffffffffffcf4,in_stack_fffffffffffffd20);
  if (eVar2 != 0xc) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xc);
    in_stack_fffffffffffffd10 = (exr_context_t)std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(0xc);
    poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffd10,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  eVar2 = exr_attr_chlist_destroy
                    (in_stack_fffffffffffffd18,(exr_attr_chlist_t *)in_stack_fffffffffffffd10);
  if (eVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    in_stack_fffffffffffffd00 = (exr_attr_chlist_t *)std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffd00,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf4,(char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  eVar2 = exr_attr_chlist_destroy
                    (in_stack_fffffffffffffd18,(exr_attr_chlist_t *)in_stack_fffffffffffffd10);
  if (eVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar5 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,(char *)poVar3,in_stack_fffffffffffffcf4,
                   (char *)CONCAT44(in_stack_fffffffffffffcec,uVar6));
  }
  return;
}

Assistant:

static void
testChlistHelper (exr_context_t f)
{
    exr_attr_chlist_t cl = {0};

    exr_attr_chlist_destroy (f, NULL);
    exr_attr_chlist_destroy (f, &cl);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_attr_chlist_init (NULL, NULL, 0));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_chlist_init (f, NULL, 0));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_chlist_init (f, &cl, -1));
    EXRCORE_TEST_RVAL (exr_attr_chlist_init (f, &cl, 0));
    exr_attr_chlist_destroy (f, &cl);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_attr_chlist_destroy (NULL, &cl));

    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY, exr_attr_chlist_init (f, &cl, 3));
    exr_attr_chlist_destroy (f, &cl);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_chlist_add (
            NULL,
            &cl,
            "foo",
            EXR_PIXEL_HALF,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            1,
            1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f,
            NULL,
            "foo",
            EXR_PIXEL_HALF,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            1,
            1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f,
            &cl,
            "foo",
            EXR_PIXEL_LAST_TYPE,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            1,
            1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f,
            &cl,
            "foo",
            (exr_pixel_type_t) -1,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            1,
            1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f,
            &cl,
            "foo",
            EXR_PIXEL_HALF,
            (exr_perceptual_treatment_t) 2,
            1,
            1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f, &cl, "foo", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 0, 1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f,
            &cl,
            "foo",
            EXR_PIXEL_HALF,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            -1,
            1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f, &cl, "foo", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 0));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f, &cl, "foo", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LINEAR, 1, -1));

    EXRCORE_TEST_RVAL (exr_attr_chlist_add (
        f, &cl, "foo", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LINEAR, 1, 2));
    EXRCORE_TEST (cl.num_channels == 1);
    EXRCORE_TEST (0 == strcmp (cl.entries[0].name.str, "foo"));
    EXRCORE_TEST (cl.entries[0].pixel_type == EXR_PIXEL_HALF);
    EXRCORE_TEST (cl.entries[0].p_linear == (uint8_t) EXR_PERCEPTUALLY_LINEAR);
    EXRCORE_TEST (cl.entries[0].x_sampling == 1);
    EXRCORE_TEST (cl.entries[0].y_sampling == 2);
    EXRCORE_TEST_RVAL (exr_attr_chlist_destroy (f, &cl));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f, &cl, "", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LINEAR, 1, 1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f, &cl, NULL, EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LINEAR, 1, 1));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add_with_length (
            f, &cl, "R", 0, EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LINEAR, 1, 1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NAME_TOO_LONG,
        exr_attr_chlist_add_with_length (
            f, &cl, "R", 1024, EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LINEAR, 1, 1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add_with_length (
            f,
            &cl,
            "R",
            1,
            EXR_PIXEL_LAST_TYPE,
            EXR_PERCEPTUALLY_LINEAR,
            1,
            1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add_with_length (
            f,
            &cl,
            "R",
            1,
            EXR_PIXEL_HALF,
            (exr_perceptual_treatment_t) 7,
            1,
            1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add_with_length (
            f,
            &cl,
            "R",
            1,
            EXR_PIXEL_FLOAT,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            0,
            1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add_with_length (
            f,
            &cl,
            "R",
            1,
            EXR_PIXEL_UINT,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            1,
            -1));
    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY,
        exr_attr_chlist_add_with_length (
            f,
            &cl,
            "R",
            1,
            EXR_PIXEL_HALF,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            1,
            1));
    EXRCORE_TEST_RVAL_FAIL_MALLOC_AFTER (
        1,
        EXR_ERR_OUT_OF_MEMORY,
        exr_attr_chlist_add_with_length (
            f,
            &cl,
            "R",
            1,
            EXR_PIXEL_HALF,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            1,
            1));

    EXRCORE_TEST_RVAL (exr_attr_chlist_add (
        f, &cl, "R", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1));
    EXRCORE_TEST_RVAL (exr_attr_chlist_add (
        f, &cl, "G", EXR_PIXEL_FLOAT, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1));
    EXRCORE_TEST_RVAL (exr_attr_chlist_add (
        f, &cl, "B", EXR_PIXEL_UINT, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1));
    EXRCORE_TEST (cl.num_channels == 3);
    EXRCORE_TEST (0 == strcmp (cl.entries[0].name.str, "B"));
    EXRCORE_TEST (0 == strcmp (cl.entries[1].name.str, "G"));
    EXRCORE_TEST (0 == strcmp (cl.entries[2].name.str, "R"));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f, &cl, "B", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1));
    EXRCORE_TEST (cl.num_channels == 3);

    exr_attr_chlist_t cl2 = {0};
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_chlist_duplicate (NULL, &cl2, &cl));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_chlist_duplicate (f, NULL, &cl));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_chlist_duplicate (f, &cl2, NULL));
    EXRCORE_TEST_RVAL (exr_attr_chlist_duplicate (f, &cl2, &cl));
    EXRCORE_TEST (cl2.num_channels == 3);
    EXRCORE_TEST (0 == strcmp (cl2.entries[0].name.str, "B"));
    EXRCORE_TEST (0 == strcmp (cl2.entries[1].name.str, "G"));
    EXRCORE_TEST (0 == strcmp (cl2.entries[2].name.str, "R"));
    EXRCORE_TEST_RVAL (exr_attr_chlist_destroy (f, &cl2));
    EXRCORE_TEST_RVAL_FAIL_MALLOC_AFTER (
        1, EXR_ERR_OUT_OF_MEMORY, exr_attr_chlist_duplicate (f, &cl2, &cl));
    EXRCORE_TEST_RVAL (exr_attr_chlist_destroy (f, &cl2));

    /* without a file, max will be 31 */
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NAME_TOO_LONG,
        exr_attr_chlist_add (
            f,
            &cl,
            "reallongreallongreallonglongname",
            EXR_PIXEL_HALF,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            1,
            1));
    EXRCORE_TEST_RVAL (exr_attr_chlist_destroy (f, &cl));

    // make sure we can re-delete something?
    EXRCORE_TEST_RVAL (exr_attr_chlist_destroy (f, &cl));
}